

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

CURLcode Curl_http2_stream_pause(Curl_easy *data,_Bool pause)

{
  connectdata *pcVar1;
  nghttp2_session *session;
  uint error_code;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  
  pcVar1 = data->conn;
  CVar3 = CURLE_OK;
  if (((pcVar1->handler->protocol & 3) != 0) &&
     (session = (pcVar1->proto).httpc.h2, CVar3 = CURLE_OK, session != (nghttp2_session *)0x0)) {
    error_code = nghttp2_session_set_local_window_size
                           (session,'\0',((data->req).p.http)->stream_id,(uint)!pause << 0x19);
    if (error_code == 0) {
      iVar2 = h2_session_send(data,(pcVar1->proto).httpc.h2);
      CVar3 = CURLE_SEND_ERROR;
      if (iVar2 == 0) {
        CVar3 = CURLE_OK;
      }
    }
    else {
      pcVar4 = nghttp2_strerror(error_code);
      Curl_failf(data,"nghttp2_session_set_local_window_size() failed: %s(%d)",pcVar4,
                 (ulong)error_code);
      CVar3 = CURLE_HTTP2;
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_http2_stream_pause(struct Curl_easy *data, bool pause)
{
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  /* if it isn't HTTP/2, we're done */
  if(!(data->conn->handler->protocol & PROTO_FAMILY_HTTP) ||
     !data->conn->proto.httpc.h2)
    return CURLE_OK;
#ifdef NGHTTP2_HAS_SET_LOCAL_WINDOW_SIZE
  else {
    struct HTTP *stream = data->req.p.http;
    struct http_conn *httpc = &data->conn->proto.httpc;
    uint32_t window = !pause * HTTP2_HUGE_WINDOW_SIZE;
    int rv = nghttp2_session_set_local_window_size(httpc->h2,
                                                   NGHTTP2_FLAG_NONE,
                                                   stream->stream_id,
                                                   window);
    if(rv) {
      failf(data, "nghttp2_session_set_local_window_size() failed: %s(%d)",
            nghttp2_strerror(rv), rv);
      return CURLE_HTTP2;
    }

    /* make sure the window update gets sent */
    rv = h2_session_send(data, httpc->h2);
    if(rv)
      return CURLE_SEND_ERROR;

    DEBUGF(infof(data, "Set HTTP/2 window size to %u for stream %u",
                 window, stream->stream_id));

#ifdef DEBUGBUILD
    {
      /* read out the stream local window again */
      uint32_t window2 =
        nghttp2_session_get_stream_local_window_size(httpc->h2,
                                                     stream->stream_id);
      DEBUGF(infof(data, "HTTP/2 window size is now %u for stream %u",
                   window2, stream->stream_id));
    }
#endif
  }
#endif
  return CURLE_OK;
}